

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void print_fasta_seq(kseq_t *seq,int n)

{
  uint uVar1;
  int iVar2;
  char *__s;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar1 = (uint)(seq->seq).l;
  __s = (char *)malloc((long)(n + 1));
  if (__s == (char *)0x0) {
    fwrite("print_seq: out of memory for seqbuf!\n",0x25,1,_stderr);
    exit(1);
  }
  iVar3 = 0x32;
  if (0 < n) {
    iVar3 = n;
  }
  if ((int)uVar1 <= iVar3) {
    pcVar4 = (seq->name).s;
    if ((seq->comment).l == 0) {
      printf(">%s\n%s\n",pcVar4,(seq->seq).s);
    }
    else {
      printf(">%s %s\n%s\n",pcVar4,(seq->comment).s,(seq->seq).s);
    }
    goto LAB_00103dbd;
  }
  if ((seq->comment).s == (char *)0x0) {
    pcVar4 = (seq->name).s;
LAB_00103d44:
    printf(">%s\n",pcVar4);
  }
  else {
    pcVar4 = (seq->name).s;
    if ((seq->comment).l == 0) goto LAB_00103d44;
    printf(">%s %s\n",pcVar4);
  }
  iVar2 = 0;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    if (iVar2 < iVar3) {
      __s[iVar2] = (seq->seq).s[uVar5];
      iVar2 = iVar2 + 1;
    }
    else {
      __s[iVar2] = '\0';
      puts(__s);
      *__s = (seq->seq).s[uVar5];
      iVar2 = 1;
    }
  }
  if (iVar2 < iVar3) {
    __s[iVar2] = '\0';
  }
  if (*__s != '\0') {
    puts(__s);
  }
LAB_00103dbd:
  free(__s);
  return;
}

Assistant:

void print_fasta_seq(kseq_t *seq, int n)
{
	int l = seq->seq.l;   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (n + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (n <= 0)
		n = 50;

	if (l > n) {                  /* seqlength is > column length - split sequence */
		if (seq->comment.s == NULL) {
			printf(">%s\n",seq->name.s);
		} else {
			if (seq->comment.l == 0)
				printf(">%s\n",seq->name.s);
			else
				printf(">%s %s\n",seq->name.s, seq->comment.s);
		}

		for (x=0; x<l;x++) {
			if (i < n) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq->seq.s[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				printf("%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq->seq.s[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<n)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			printf("%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (seq->comment.l == 0)
			printf(">%s\n%s\n",seq->name.s,seq->seq.s);
		else
			printf(">%s %s\n%s\n",seq->name.s,seq->comment.s,seq->seq.s);
	}
	free(seqbuf);
}